

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

PersistentRowGroupData * __thiscall duckdb::RowGroup::SerializeRowGroupInfo(RowGroup *this)

{
  bool bVar1;
  __int_type _Var2;
  idx_t *in_RSI;
  PersistentRowGroupData *in_RDI;
  shared_ptr<duckdb::ColumnData,_true> *col;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *__range1;
  PersistentRowGroupData *result;
  value_type *in_stack_ffffffffffffff48;
  PersistentColumnData *in_stack_ffffffffffffff50;
  ColumnData *in_stack_ffffffffffffff58;
  undefined1 local_78 [64];
  reference local_38;
  shared_ptr<duckdb::ColumnData,_true> *local_30;
  __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
  local_28;
  idx_t *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  PersistentRowGroupData::PersistentRowGroupData
            ((PersistentRowGroupData *)in_stack_ffffffffffffff50);
  local_20 = in_RSI + 8;
  local_28._M_current =
       (shared_ptr<duckdb::ColumnData,_true> *)
       ::std::
       vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
       ::begin((vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                *)in_stack_ffffffffffffff48);
  local_30 = (shared_ptr<duckdb::ColumnData,_true> *)
             ::std::
             vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
             ::end((vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
               ::operator*(&local_28);
    in_stack_ffffffffffffff50 = (PersistentColumnData *)&in_RDI->column_data;
    in_stack_ffffffffffffff58 =
         shared_ptr<duckdb::ColumnData,_true>::operator->
                   ((shared_ptr<duckdb::ColumnData,_true> *)in_stack_ffffffffffffff50);
    (*in_stack_ffffffffffffff58->_vptr_ColumnData[0x1f])(local_78);
    ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
    push_back((vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_> *
              )in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    PersistentColumnData::~PersistentColumnData(in_stack_ffffffffffffff50);
    __gnu_cxx::
    __normal_iterator<const_duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
    ::operator++(&local_28);
  }
  in_RDI->start = *in_RSI;
  _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff58);
  in_RDI->count = _Var2;
  return in_RDI;
}

Assistant:

PersistentRowGroupData RowGroup::SerializeRowGroupInfo() const {
	// all columns are persistent - serialize
	PersistentRowGroupData result;
	for (auto &col : columns) {
		result.column_data.push_back(col->Serialize());
	}
	result.start = start;
	result.count = count;
	return result;
}